

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::EnumValueShortName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,EnumValueDescriptor *descriptor)

{
  EnumDescriptor *this_00;
  EnumDescriptor *descriptor_00;
  EnumValueDescriptor *descriptor_01;
  string local_a0;
  string *local_80;
  string *long_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string *local_48;
  string *long_name_prefix;
  string *local_20;
  string *class_name;
  EnumValueDescriptor *descriptor_local;
  
  class_name = (string *)this;
  descriptor_local = (EnumValueDescriptor *)__return_storage_ptr__;
  this_00 = EnumValueDescriptor::type((EnumValueDescriptor *)this);
  EnumName_abi_cxx11_((string *)&long_name_prefix,(objectivec *)this_00,descriptor_00);
  local_20 = (string *)&long_name_prefix;
  std::operator+(&local_68,(string *)&long_name_prefix,"_");
  local_48 = &local_68;
  EnumValueName_abi_cxx11_(&local_a0,(objectivec *)class_name,descriptor_01);
  local_80 = &local_a0;
  StripPrefixString(__return_storage_ptr__,local_80,local_48);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&long_name_prefix);
  return __return_storage_ptr__;
}

Assistant:

string EnumValueShortName(const EnumValueDescriptor* descriptor) {
  // Enum value names (EnumValueName above) are the enum name turned into
  // a class name and then the value name is CamelCased and concatenated; the
  // whole thing then gets sanitized for reserved words.
  // The "short name" is intended to be the final leaf, the value name; but
  // you can't simply send that off to sanitize as that could result in it
  // getting modified when the full name didn't.  For example enum
  // "StorageModes" has a value "retain".  So the full name is
  // "StorageModes_Retain", but if we sanitize "retain" it would become
  // "RetainValue".
  // So the right way to get the short name is to take the full enum name
  // and then strip off the enum name (leaving the value name and anything
  // done by sanitize).
  const string& class_name = EnumName(descriptor->type());
  const string& long_name_prefix = class_name + "_";
  const string& long_name = EnumValueName(descriptor);
  return StripPrefixString(long_name, long_name_prefix);
}